

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O0

void fix_interp_filter(InterpFilter *interp_filter,FRAME_COUNTS *counts)

{
  long in_RSI;
  char *in_RDI;
  int i_1;
  int j;
  int i;
  int num_filters_used;
  int count [3];
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c [3];
  long local_10;
  char *local_8;
  
  if (*in_RDI == '\x04') {
    local_10 = in_RSI;
    local_8 = in_RDI;
    memset(local_1c,0,0xc);
    local_20 = 0;
    for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
      for (local_28 = 0; local_28 < 0x10; local_28 = local_28 + 1) {
        local_1c[local_24] =
             *(int *)(local_10 + (long)local_28 * 0xc + (long)local_24 * 4) + local_1c[local_24];
      }
      local_20 = (uint)(0 < local_1c[local_24]) + local_20;
    }
    if (local_20 == 1) {
      for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
        if (local_1c[local_2c] != 0) {
          *local_8 = (char)local_2c;
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void fix_interp_filter(InterpFilter *const interp_filter,
                              const FRAME_COUNTS *const counts) {
  if (*interp_filter == SWITCHABLE) {
    // Check to see if only one of the filters is actually used
    int count[SWITCHABLE_FILTERS] = { 0 };
    int num_filters_used = 0;
    for (int i = 0; i < SWITCHABLE_FILTERS; ++i) {
      for (int j = 0; j < SWITCHABLE_FILTER_CONTEXTS; ++j)
        count[i] += counts->switchable_interp[j][i];
      num_filters_used += (count[i] > 0);
    }
    if (num_filters_used == 1) {
      // Only one filter is used. So set the filter at frame level
      for (int i = 0; i < SWITCHABLE_FILTERS; ++i) {
        if (count[i]) {
          *interp_filter = i;
          break;
        }
      }
    }
  }
}